

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# unqlite.c
# Opt level: O1

int jx9_hashmap_merge(jx9_context *pCtx,int nArg,jx9_value **apArg)

{
  jx9_hashmap *pMap;
  jx9_hashmap *pjVar1;
  jx9_hashmap_node *pjVar2;
  jx9_vm *pjVar3;
  sxi32 sVar4;
  jx9_value *pSrc;
  jx9_hashmap_node **ppjVar5;
  jx9_value *pjVar6;
  uint uVar7;
  ulong uVar8;
  anon_union_8_3_18420de5_for_x local_78;
  undefined8 uStack_70;
  jx9_vm *local_68;
  jx9_vm *pjStack_60;
  undefined8 local_58;
  undefined8 uStack_50;
  undefined8 local_48;
  undefined8 uStack_40;
  
  if (0 < nArg) {
    pSrc = jx9_context_new_array(pCtx);
    if (pSrc != (jx9_value *)0x0) {
      pMap = (jx9_hashmap *)(pSrc->x).pOther;
      uVar8 = 0;
      do {
        pjVar6 = apArg[uVar8];
        if ((pjVar6->iFlags & 0x40) == 0) {
          if ((pSrc->iFlags & 0x40) != 0) {
            HashmapInsert((jx9_hashmap *)(pSrc->x).pOther,(jx9_value *)0x0,pjVar6);
          }
        }
        else {
          pjVar1 = (jx9_hashmap *)(pjVar6->x).iVal;
          if ((pjVar1 != pMap) && (pjVar1->nEntry != 0)) {
            ppjVar5 = &pjVar1->pFirst;
            uVar7 = 0;
            do {
              pjVar2 = *ppjVar5;
              pjVar3 = pjVar2->pMap->pVm;
              if (pjVar2->nValIdx < (pjVar3->aMemObj).nUsed) {
                pjVar6 = (jx9_value *)
                         ((ulong)(pjVar2->nValIdx * (pjVar3->aMemObj).eSize) +
                         (long)(pjVar3->aMemObj).pBase);
              }
              else {
                pjVar6 = (jx9_value *)0x0;
              }
              if (pjVar2->iType == 2) {
                local_68 = pMap->pVm;
                uStack_40 = 0;
                local_78.rVal = 0.0;
                local_58 = 0;
                uStack_50 = 0;
                local_48 = 0;
                uStack_70 = 1;
                pjStack_60 = local_68;
                jx9MemObjStringAppend
                          ((jx9_value *)&local_78,(char *)(pjVar2->xKey).sKey.pBlob,
                           (pjVar2->xKey).sKey.nByte);
                sVar4 = HashmapInsert(pMap,(jx9_value *)&local_78,pjVar6);
                jx9MemObjRelease((jx9_value *)&local_78);
              }
              else {
                sVar4 = HashmapInsert(pMap,(jx9_value *)0x0,pjVar6);
              }
              if (sVar4 != 0) break;
              ppjVar5 = &pjVar2->pPrev;
              uVar7 = uVar7 + 1;
            } while (uVar7 < pjVar1->nEntry);
          }
        }
        uVar8 = uVar8 + 1;
        if (uVar8 == (uint)nArg) {
          jx9MemObjStore(pSrc,pCtx->pRet);
          return 0;
        }
      } while( true );
    }
  }
  jx9MemObjRelease(pCtx->pRet);
  return 0;
}

Assistant:

static int jx9_hashmap_merge(jx9_context *pCtx, int nArg, jx9_value **apArg)
{
	jx9_hashmap *pMap, *pSrc;
	jx9_value *pArray;
	int i;
	if( nArg < 1 ){
		/* Missing arguments, return NULL */
		jx9_result_null(pCtx);
		return JX9_OK;
	}
	/* Create a new array */
	pArray = jx9_context_new_array(pCtx);
	if( pArray == 0 ){
		jx9_result_null(pCtx);
		return JX9_OK;
	}
	/* Point to the internal representation of the hashmap */
	pMap = (jx9_hashmap *)pArray->x.pOther;
	/* Start merging */
	for( i = 0 ; i < nArg ; i++ ){
		/* Make sure we are dealing with a valid hashmap */
		if( !jx9_value_is_json_array(apArg[i]) ){
			/* Insert scalar value */
			jx9_array_add_elem(pArray, 0, apArg[i]);
		}else{
			pSrc = (jx9_hashmap *)apArg[i]->x.pOther;
			/* Merge the two hashmaps */
			HashmapMerge(pSrc, pMap);
		}
	}
	/* Return the freshly created array */
	jx9_result_value(pCtx, pArray);
	return JX9_OK;
}